

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcemanager.cpp
# Opt level: O2

void __thiscall ResourceManager::ResourceManager(ResourceManager *this)

{
  _Rb_tree_header *p_Var1;
  
  p_Var1 = &(this->loadedTextures)._M_t._M_impl.super__Rb_tree_header;
  (this->loadedTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->loadedTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->loadedTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->loadedTextures)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->loadedTextures)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->loadedShaders)._M_t._M_impl.super__Rb_tree_header;
  (this->loadedShaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->loadedShaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->loadedShaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->loadedShaders)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->loadedShaders)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->loadedMeshes)._M_t._M_impl.super__Rb_tree_header;
  (this->loadedMeshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->loadedMeshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->loadedMeshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->loadedMeshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->loadedMeshes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

ResourceManager::ResourceManager()
{
}